

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O2

void __thiscall OpenMD::RestReader::readFrameProperties(RestReader *this,istream *inputStream)

{
  long lVar1;
  long *plVar2;
  char *__s;
  string line;
  allocator<char> local_39;
  string local_38 [32];
  
  __s = this->buffer;
  std::istream::getline((char *)inputStream,(long)__s);
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  lVar1 = std::__cxx11::string::find((char *)local_38,0x241e30);
  if (lVar1 == -1) {
    builtin_strncpy(painCave.errMsg,"RestReader Error: Missing <FrameData>\n",0x27);
    painCave.isFatal = 1;
    simError();
  }
  do {
    plVar2 = (long *)std::istream::getline((char *)inputStream,(long)__s);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
    std::__cxx11::string::assign((char *)local_38);
    lVar1 = std::__cxx11::string::find((char *)local_38,0x241e63);
  } while (lVar1 == -1);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void RestReader::readFrameProperties(std::istream& inputStream) {
    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<FrameData>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: Missing <FrameData>\n");
      painCave.isFatal = 1;
      simError();
    }

    // restraints don't care about frame data (unless we need to wrap
    // coordinates, but we'll worry about that later), so
    // we'll just scan ahead until the end of the frame data:

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</FrameData>") != std::string::npos) { break; }
    }
  }